

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcSectionedSpine::~IfcSectionedSpine(IfcSectionedSpine *this)

{
  pointer pLVar1;
  pointer pLVar2;
  
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcSectionedSpine_008d13e0;
  *(undefined ***)&this->field_0x68 = &PTR__IfcSectionedSpine_008d1458;
  *(undefined ***)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcSectionedSpine_008d1408;
  *(undefined ***)
   &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcSectionedSpine_008d1430;
  pLVar1 = (this->CrossSectionPositions).
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar1 != (pointer)0x0) {
    operator_delete(pLVar1);
  }
  pLVar2 = (this->CrossSections).
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar2 != (pointer)0x0) {
    operator_delete(pLVar2);
  }
  operator_delete(this);
  return;
}

Assistant:

IfcSectionedSpine() : Object("IfcSectionedSpine") {}